

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddImportedTarget(cmMakefile *this,string *name,TargetType type,bool global)

{
  auto_ptr<cmTarget> aVar1;
  cmTarget *this_00;
  mapped_type *ppcVar2;
  auto_ptr<cmTarget> target;
  auto_ptr<cmTarget> local_38;
  cmTarget *local_30;
  
  this_00 = (cmTarget *)operator_new(0x278);
  cmTarget::cmTarget(this_00);
  local_38.x_ = this_00;
  cmTarget::SetType(this_00,type,name);
  cmTarget::MarkAsImported(this_00,global);
  cmTarget::SetMakefile(local_38.x_,this);
  aVar1.x_ = local_38.x_;
  ppcVar2 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->ImportedTargets,name);
  *ppcVar2 = aVar1.x_;
  cmGlobalGenerator::IndexTarget(this->GlobalGenerator,local_38.x_);
  local_30 = local_38.x_;
  std::vector<cmTarget*,std::allocator<cmTarget*>>::emplace_back<cmTarget*>
            ((vector<cmTarget*,std::allocator<cmTarget*>> *)&this->ImportedTargetsOwned,&local_30);
  aVar1.x_ = local_38.x_;
  local_38.x_ = (cmTarget *)0x0;
  cmsys::auto_ptr<cmTarget>::~auto_ptr(&local_38);
  return aVar1.x_;
}

Assistant:

cmTarget*
cmMakefile::AddImportedTarget(const std::string& name,
                              cmState::TargetType type,
                              bool global)
{
  // Create the target.
  cmsys::auto_ptr<cmTarget> target(new cmTarget);
  target->SetType(type, name);
  target->MarkAsImported(global);
  target->SetMakefile(this);

  // Add to the set of available imported targets.
  this->ImportedTargets[name] = target.get();
  this->GetGlobalGenerator()->IndexTarget(target.get());

  // Transfer ownership to this cmMakefile object.
  this->ImportedTargetsOwned.push_back(target.get());
  return target.release();
}